

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
BinaryExpr<const_protozero::const_varint_iterator<long>_&,_const_protozero::const_varint_iterator<long>_&>
::streamReconstructedExpression
          (BinaryExpr<const_protozero::const_varint_iterator<long>_&,_const_protozero::const_varint_iterator<long>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,Detail::unprintableString_abi_cxx11_,
             DAT_00258ed0 + Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,Detail::unprintableString_abi_cxx11_,
             DAT_00258ed0 + Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)local_70;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_50,lhs,op,in_R9);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }